

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::IdleCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd,bool ReleaseResources)

{
  pthread_mutex_t *ppVar1;
  Uint64 FenceValue;
  Uint64 UVar2;
  char (*in_RCX) [27];
  lock_guard<std::mutex> Lock;
  pthread_mutex_t *__mutex;
  string msg;
  
  if (this->m_CmdQueueCount <= (ulong)QueueInd.m_Value) {
    FormatString<char[26],char[27]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5b55cc,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"IdleCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)&msg);
  }
  __mutex = (pthread_mutex_t *)(this->m_CommandQueues + QueueInd.m_Value);
  std::mutex::lock((mutex *)&__mutex->__data);
  if (ReleaseResources) {
    LOCK();
    ppVar1 = __mutex + 1;
    UVar2 = ppVar1->__align;
    ppVar1->__align = ppVar1->__align + 1;
    UNLOCK();
  }
  else {
    UVar2 = 0;
  }
  FenceValue = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x30))();
  pthread_mutex_unlock(__mutex);
  if (ReleaseResources) {
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardStaleResources
              ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)((long)__mutex + 0x38)
               ,UVar2,FenceValue);
    UVar2 = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x28))();
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
              ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)((long)__mutex + 0x38)
               ,UVar2);
  }
  return;
}

Assistant:

void IdleCommandQueue(SoftwareQueueIndex QueueInd, bool ReleaseResources)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];

        Uint64 CmdBufferNumber = 0;
        Uint64 FenceValue      = 0;
        {
            std::lock_guard<std::mutex> Lock{Queue.Mtx};

            if (ReleaseResources)
            {
                // Increment the command buffer number before idling the queue.
                // This will make sure that any resource released while this function
                // is running will be associated with the next command buffer submission.
                CmdBufferNumber = Queue.NextCmdBufferNumber.fetch_add(1);
                // fetch_add returns the original value immediately preceding the addition.
            }

            FenceValue = Queue.CmdQueue->WaitForIdle();
        }

        if (ReleaseResources)
        {
            Queue.ReleaseQueue.DiscardStaleResources(CmdBufferNumber, FenceValue);
            Queue.ReleaseQueue.Purge(Queue.CmdQueue->GetCompletedFenceValue());
        }
    }